

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void pffft_real_preprocess(int Ncvec,v4sf *in,v4sf *out,v4sf *e)

{
  v4sf *pafVar1;
  v4sf *pafVar2;
  v4sf *pafVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float ci3;
  float cr3;
  float ci2;
  float cr2;
  float ci1;
  float cr1;
  float ci0;
  float cr0;
  v4sf_union *uout;
  v4sf_union Xi;
  v4sf_union Xr;
  int local_1050;
  int local_104c;
  int dk;
  int k;
  v4sf *e_local;
  v4sf *out_local;
  v4sf *in_local;
  int Ncvec_local;
  __m128 tmp0_3;
  __m128 tmp1_3;
  __m128 tmp2_3;
  __m128 tmp3_3;
  __m128 tmp0_2;
  __m128 tmp1_2;
  __m128 tmp2_2;
  __m128 tmp3_2;
  v4sf tmp_5;
  v4sf tmp_4;
  v4sf tmp_3;
  v4sf di1_1;
  v4sf si1_1;
  v4sf di0_1;
  v4sf si0_1;
  v4sf dr1_1;
  v4sf sr1_1;
  v4sf dr0_1;
  v4sf sr0_1;
  v4sf i3_1;
  v4sf r3_1;
  v4sf i2_1;
  v4sf r2_1;
  v4sf i1_1;
  v4sf r1_1;
  v4sf i0_1;
  v4sf r0_1;
  float local_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float local_d68;
  float fStack_d64;
  float fStack_d60;
  float fStack_d5c;
  float local_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float local_d48;
  float fStack_d44;
  float fStack_d40;
  float fStack_d3c;
  float local_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  float local_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  float local_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float local_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float local_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float local_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float local_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  v4sf tmp_2;
  v4sf tmp_1;
  v4sf tmp;
  v4sf di1;
  v4sf si1;
  v4sf di0;
  v4sf si0;
  v4sf dr1;
  v4sf sr1;
  v4sf dr0;
  v4sf sr0;
  v4sf i3;
  v4sf r3;
  v4sf i2;
  v4sf r2;
  v4sf i1;
  v4sf r1;
  v4sf i0;
  v4sf r0;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  
  local_1050 = Ncvec / 4;
  _dk = e;
  e_local = out;
  out_local = in;
  in_local._4_4_ = Ncvec;
  if (in == out) {
    __assert_fail("in != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x626,"void pffft_real_preprocess(int, const v4sf *, v4sf *, const v4sf *)");
  }
  for (local_104c = 0; local_104c < 4; local_104c = local_104c + 1) {
    *(float *)((long)&Xi + (long)local_104c * 4 + 8) = (*out_local)[local_104c << 3];
    *(float *)((long)&uout + (long)local_104c * 4) = (*out_local)[local_104c * 8 + 4];
  }
  fStack_4f4 = (float)((ulong)*(undefined8 *)*out_local >> 0x20);
  fStack_4f0 = (float)*(undefined8 *)(*out_local + 2);
  fStack_4ec = (float)((ulong)*(undefined8 *)(*out_local + 2) >> 0x20);
  fStack_504 = (float)((ulong)*(undefined8 *)out_local[6] >> 0x20);
  fStack_500 = (float)*(undefined8 *)(out_local[6] + 2);
  fStack_4fc = (float)((ulong)*(undefined8 *)(out_local[6] + 2) >> 0x20);
  fStack_514 = (float)((ulong)*(undefined8 *)out_local[2] >> 0x20);
  fStack_510 = (float)*(undefined8 *)(out_local[2] + 2);
  fStack_50c = (float)((ulong)*(undefined8 *)(out_local[2] + 2) >> 0x20);
  fStack_524 = (float)((ulong)*(undefined8 *)out_local[4] >> 0x20);
  fStack_520 = (float)*(undefined8 *)(out_local[4] + 2);
  fStack_51c = (float)((ulong)*(undefined8 *)(out_local[4] + 2) >> 0x20);
  fStack_534 = (float)((ulong)*(undefined8 *)out_local[1] >> 0x20);
  fStack_530 = (float)*(undefined8 *)(out_local[1] + 2);
  fStack_52c = (float)((ulong)*(undefined8 *)(out_local[1] + 2) >> 0x20);
  fStack_544 = (float)((ulong)*(undefined8 *)out_local[7] >> 0x20);
  fStack_540 = (float)*(undefined8 *)(out_local[7] + 2);
  fStack_53c = (float)((ulong)*(undefined8 *)(out_local[7] + 2) >> 0x20);
  fStack_554 = (float)((ulong)*(undefined8 *)out_local[3] >> 0x20);
  fStack_550 = (float)*(undefined8 *)(out_local[3] + 2);
  fStack_54c = (float)((ulong)*(undefined8 *)(out_local[3] + 2) >> 0x20);
  fStack_564 = (float)((ulong)*(undefined8 *)out_local[5] >> 0x20);
  fStack_560 = (float)*(undefined8 *)(out_local[5] + 2);
  fStack_55c = (float)((ulong)*(undefined8 *)(out_local[5] + 2) >> 0x20);
  fVar4 = (fStack_4f4 + fStack_504) - (fStack_514 + fStack_524);
  fVar10 = (fStack_4f0 + fStack_500) - (fStack_510 + fStack_520);
  fVar16 = (fStack_4ec + fStack_4fc) - (fStack_50c + fStack_51c);
  fVar5 = (fStack_4f4 - fStack_504) - (fStack_554 + fStack_564);
  fVar11 = (fStack_4f0 - fStack_500) - (fStack_550 + fStack_560);
  fVar17 = (fStack_4ec - fStack_4fc) - (fStack_54c + fStack_55c);
  fVar6 = (fStack_4f4 - fStack_504) + fStack_554 + fStack_564;
  fVar12 = (fStack_4f0 - fStack_500) + fStack_550 + fStack_560;
  fVar18 = (fStack_4ec - fStack_4fc) + fStack_54c + fStack_55c;
  fVar7 = (fStack_534 - fStack_544) + (fStack_554 - fStack_564);
  fVar13 = (fStack_530 - fStack_540) + (fStack_550 - fStack_560);
  fVar19 = (fStack_52c - fStack_53c) + (fStack_54c - fStack_55c);
  fVar8 = (fStack_534 + fStack_544) - (fStack_514 - fStack_524);
  fVar14 = (fStack_530 + fStack_540) - (fStack_510 - fStack_520);
  fVar20 = (fStack_52c + fStack_53c) - (fStack_50c - fStack_51c);
  fVar9 = fStack_534 + fStack_544 + (fStack_514 - fStack_524);
  fVar15 = fStack_530 + fStack_540 + (fStack_510 - fStack_520);
  fVar21 = fStack_52c + fStack_53c + (fStack_50c - fStack_51c);
  fStack_384 = (float)((ulong)*(undefined8 *)_dk[1] >> 0x20);
  fStack_380 = (float)*(undefined8 *)(_dk[1] + 2);
  fStack_37c = (float)((ulong)*(undefined8 *)(_dk[1] + 2) >> 0x20);
  fStack_3a4 = (float)((ulong)*(undefined8 *)*_dk >> 0x20);
  fStack_3a0 = (float)*(undefined8 *)(*_dk + 2);
  fStack_39c = (float)((ulong)*(undefined8 *)(*_dk + 2) >> 0x20);
  fStack_3c4 = (float)((ulong)*(undefined8 *)_dk[1] >> 0x20);
  fStack_3c0 = (float)*(undefined8 *)(_dk[1] + 2);
  fStack_3bc = (float)((ulong)*(undefined8 *)(_dk[1] + 2) >> 0x20);
  fStack_3e4 = (float)((ulong)*(undefined8 *)*_dk >> 0x20);
  fStack_3e0 = (float)*(undefined8 *)(*_dk + 2);
  fStack_3dc = (float)((ulong)*(undefined8 *)(*_dk + 2) >> 0x20);
  fStack_404 = (float)((ulong)*(undefined8 *)_dk[3] >> 0x20);
  fStack_400 = (float)*(undefined8 *)(_dk[3] + 2);
  fStack_3fc = (float)((ulong)*(undefined8 *)(_dk[3] + 2) >> 0x20);
  fStack_424 = (float)((ulong)*(undefined8 *)_dk[2] >> 0x20);
  fStack_420 = (float)*(undefined8 *)(_dk[2] + 2);
  fStack_41c = (float)((ulong)*(undefined8 *)(_dk[2] + 2) >> 0x20);
  fStack_444 = (float)((ulong)*(undefined8 *)_dk[3] >> 0x20);
  fStack_440 = (float)*(undefined8 *)(_dk[3] + 2);
  fStack_43c = (float)((ulong)*(undefined8 *)(_dk[3] + 2) >> 0x20);
  fStack_464 = (float)((ulong)*(undefined8 *)_dk[2] >> 0x20);
  fStack_460 = (float)*(undefined8 *)(_dk[2] + 2);
  fStack_45c = (float)((ulong)*(undefined8 *)(_dk[2] + 2) >> 0x20);
  fStack_484 = (float)((ulong)*(undefined8 *)_dk[5] >> 0x20);
  fStack_480 = (float)*(undefined8 *)(_dk[5] + 2);
  fStack_47c = (float)((ulong)*(undefined8 *)(_dk[5] + 2) >> 0x20);
  fStack_4a4 = (float)((ulong)*(undefined8 *)_dk[4] >> 0x20);
  fStack_4a0 = (float)*(undefined8 *)(_dk[4] + 2);
  fStack_49c = (float)((ulong)*(undefined8 *)(_dk[4] + 2) >> 0x20);
  fStack_4c4 = (float)((ulong)*(undefined8 *)_dk[5] >> 0x20);
  fStack_4c0 = (float)*(undefined8 *)(_dk[5] + 2);
  fStack_4bc = (float)((ulong)*(undefined8 *)(_dk[5] + 2) >> 0x20);
  fStack_4e4 = (float)((ulong)*(undefined8 *)_dk[4] >> 0x20);
  fStack_4e0 = (float)*(undefined8 *)(_dk[4] + 2);
  fStack_4dc = (float)((ulong)*(undefined8 *)(_dk[4] + 2) >> 0x20);
  i1[3] = fVar5 * fStack_3a4 + fVar8 * fStack_3c4;
  i1[2] = fStack_4f4 + fStack_504 + fStack_514 + fStack_524;
  r1[1] = fVar6 * fStack_4a4 + fVar9 * fStack_4c4;
  r1[0] = fVar4 * fStack_424 + fVar7 * fStack_444;
  i2[3] = fVar11 * fStack_3a0 + fVar14 * fStack_3c0;
  i2[2] = fStack_4f0 + fStack_500 + fStack_510 + fStack_520;
  r2[1] = fVar12 * fStack_4a0 + fVar15 * fStack_4c0;
  r2[0] = fVar10 * fStack_420 + fVar13 * fStack_440;
  i3[3] = fVar17 * fStack_39c + fVar20 * fStack_3bc;
  i3[2] = fStack_4ec + fStack_4fc + fStack_50c + fStack_51c;
  r3[1] = fVar18 * fStack_49c + fVar21 * fStack_4bc;
  r3[0] = fVar16 * fStack_41c + fVar19 * fStack_43c;
  r2[3] = fVar8 * fStack_3e4 - fVar5 * fStack_384;
  r2[2] = (fStack_534 - fStack_544) - (fStack_554 - fStack_564);
  i1[1] = fVar9 * fStack_4e4 - fVar6 * fStack_484;
  i1[0] = fVar7 * fStack_464 - fVar4 * fStack_404;
  r3[3] = fVar14 * fStack_3e0 - fVar11 * fStack_380;
  r3[2] = (fStack_530 - fStack_540) - (fStack_550 - fStack_560);
  i2[1] = fVar15 * fStack_4e0 - fVar12 * fStack_480;
  i2[0] = fVar13 * fStack_460 - fVar10 * fStack_400;
  sr0[3] = fVar20 * fStack_3dc - fVar17 * fStack_37c;
  sr0[2] = (fStack_52c - fStack_53c) - (fStack_54c - fStack_55c);
  i3[1] = fVar21 * fStack_4dc - fVar18 * fStack_47c;
  i3[0] = fVar19 * fStack_45c - fVar16 * fStack_3fc;
  *(undefined8 *)e_local[1] = i1._8_8_;
  *(undefined8 *)(e_local[1] + 2) = r1._0_8_;
  *(undefined8 *)e_local[2] = r2._8_8_;
  *(undefined8 *)(e_local[2] + 2) = i1._0_8_;
  *(undefined8 *)e_local[3] = i2._8_8_;
  *(undefined8 *)(e_local[3] + 2) = r2._0_8_;
  *(undefined8 *)e_local[4] = r3._8_8_;
  *(undefined8 *)(e_local[4] + 2) = i2._0_8_;
  *(undefined8 *)e_local[5] = i3._8_8_;
  *(undefined8 *)(e_local[5] + 2) = r3._0_8_;
  *(undefined8 *)e_local[6] = sr0._8_8_;
  *(undefined8 *)(e_local[6] + 2) = i3._0_8_;
  for (local_104c = 1; local_104c < local_1050; local_104c = local_104c + 1) {
    pafVar3 = out_local + (local_104c << 3);
    pafVar2 = _dk + local_104c * 6;
    pafVar1 = e_local + (long)(local_104c << 3) + -1;
    local_d08 = (float)*(undefined8 *)*pafVar3;
    fStack_d04 = (float)((ulong)*(undefined8 *)*pafVar3 >> 0x20);
    fStack_d00 = (float)*(undefined8 *)(*pafVar3 + 2);
    fStack_cfc = (float)((ulong)*(undefined8 *)(*pafVar3 + 2) >> 0x20);
    local_d18 = (float)*(undefined8 *)pafVar3[6];
    fStack_d14 = (float)((ulong)*(undefined8 *)pafVar3[6] >> 0x20);
    fStack_d10 = (float)*(undefined8 *)(pafVar3[6] + 2);
    fStack_d0c = (float)((ulong)*(undefined8 *)(pafVar3[6] + 2) >> 0x20);
    local_d28 = (float)*(undefined8 *)pafVar3[2];
    fStack_d24 = (float)((ulong)*(undefined8 *)pafVar3[2] >> 0x20);
    fStack_d20 = (float)*(undefined8 *)(pafVar3[2] + 2);
    fStack_d1c = (float)((ulong)*(undefined8 *)(pafVar3[2] + 2) >> 0x20);
    local_d38 = (float)*(undefined8 *)pafVar3[4];
    fStack_d34 = (float)((ulong)*(undefined8 *)pafVar3[4] >> 0x20);
    fStack_d30 = (float)*(undefined8 *)(pafVar3[4] + 2);
    fStack_d2c = (float)((ulong)*(undefined8 *)(pafVar3[4] + 2) >> 0x20);
    local_d48 = (float)*(undefined8 *)pafVar3[1];
    fStack_d44 = (float)((ulong)*(undefined8 *)pafVar3[1] >> 0x20);
    fStack_d40 = (float)*(undefined8 *)(pafVar3[1] + 2);
    fStack_d3c = (float)((ulong)*(undefined8 *)(pafVar3[1] + 2) >> 0x20);
    local_d58 = (float)*(undefined8 *)pafVar3[7];
    fStack_d54 = (float)((ulong)*(undefined8 *)pafVar3[7] >> 0x20);
    fStack_d50 = (float)*(undefined8 *)(pafVar3[7] + 2);
    fStack_d4c = (float)((ulong)*(undefined8 *)(pafVar3[7] + 2) >> 0x20);
    local_d68 = (float)*(undefined8 *)pafVar3[3];
    fStack_d64 = (float)((ulong)*(undefined8 *)pafVar3[3] >> 0x20);
    fStack_d60 = (float)*(undefined8 *)(pafVar3[3] + 2);
    fStack_d5c = (float)((ulong)*(undefined8 *)(pafVar3[3] + 2) >> 0x20);
    local_d78 = (float)*(undefined8 *)pafVar3[5];
    fStack_d74 = (float)((ulong)*(undefined8 *)pafVar3[5] >> 0x20);
    fStack_d70 = (float)*(undefined8 *)(pafVar3[5] + 2);
    fStack_d6c = (float)((ulong)*(undefined8 *)(pafVar3[5] + 2) >> 0x20);
    fVar4 = (local_d08 + local_d18) - (local_d28 + local_d38);
    fVar10 = (fStack_d04 + fStack_d14) - (fStack_d24 + fStack_d34);
    fVar16 = (fStack_d00 + fStack_d10) - (fStack_d20 + fStack_d30);
    fVar22 = (fStack_cfc + fStack_d0c) - (fStack_d1c + fStack_d2c);
    fVar5 = (local_d08 - local_d18) - (local_d68 + local_d78);
    fVar11 = (fStack_d04 - fStack_d14) - (fStack_d64 + fStack_d74);
    fVar17 = (fStack_d00 - fStack_d10) - (fStack_d60 + fStack_d70);
    fVar23 = (fStack_cfc - fStack_d0c) - (fStack_d5c + fStack_d6c);
    fVar6 = (local_d08 - local_d18) + local_d68 + local_d78;
    fVar12 = (fStack_d04 - fStack_d14) + fStack_d64 + fStack_d74;
    fVar18 = (fStack_d00 - fStack_d10) + fStack_d60 + fStack_d70;
    fVar24 = (fStack_cfc - fStack_d0c) + fStack_d5c + fStack_d6c;
    fVar7 = (local_d48 - local_d58) + (local_d68 - local_d78);
    fVar13 = (fStack_d44 - fStack_d54) + (fStack_d64 - fStack_d74);
    fVar19 = (fStack_d40 - fStack_d50) + (fStack_d60 - fStack_d70);
    fVar25 = (fStack_d3c - fStack_d4c) + (fStack_d5c - fStack_d6c);
    fVar8 = (local_d48 + local_d58) - (local_d28 - local_d38);
    fVar14 = (fStack_d44 + fStack_d54) - (fStack_d24 - fStack_d34);
    fVar20 = (fStack_d40 + fStack_d50) - (fStack_d20 - fStack_d30);
    fVar26 = (fStack_d3c + fStack_d4c) - (fStack_d1c - fStack_d2c);
    fVar9 = local_d48 + local_d58 + (local_d28 - local_d38);
    fVar15 = fStack_d44 + fStack_d54 + (fStack_d24 - fStack_d34);
    fVar21 = fStack_d40 + fStack_d50 + (fStack_d20 - fStack_d30);
    fVar27 = fStack_d3c + fStack_d4c + (fStack_d1c - fStack_d2c);
    local_b98 = (float)*(undefined8 *)pafVar2[1];
    fStack_b94 = (float)((ulong)*(undefined8 *)pafVar2[1] >> 0x20);
    fStack_b90 = (float)*(undefined8 *)(pafVar2[1] + 2);
    fStack_b8c = (float)((ulong)*(undefined8 *)(pafVar2[1] + 2) >> 0x20);
    local_bb8 = (float)*(undefined8 *)*pafVar2;
    fStack_bb4 = (float)((ulong)*(undefined8 *)*pafVar2 >> 0x20);
    fStack_bb0 = (float)*(undefined8 *)(*pafVar2 + 2);
    fStack_bac = (float)((ulong)*(undefined8 *)(*pafVar2 + 2) >> 0x20);
    local_bd8 = (float)*(undefined8 *)pafVar2[1];
    fStack_bd4 = (float)((ulong)*(undefined8 *)pafVar2[1] >> 0x20);
    fStack_bd0 = (float)*(undefined8 *)(pafVar2[1] + 2);
    fStack_bcc = (float)((ulong)*(undefined8 *)(pafVar2[1] + 2) >> 0x20);
    local_bf8 = (float)*(undefined8 *)*pafVar2;
    fStack_bf4 = (float)((ulong)*(undefined8 *)*pafVar2 >> 0x20);
    fStack_bf0 = (float)*(undefined8 *)(*pafVar2 + 2);
    fStack_bec = (float)((ulong)*(undefined8 *)(*pafVar2 + 2) >> 0x20);
    local_c18 = (float)*(undefined8 *)pafVar2[3];
    fStack_c14 = (float)((ulong)*(undefined8 *)pafVar2[3] >> 0x20);
    fStack_c10 = (float)*(undefined8 *)(pafVar2[3] + 2);
    fStack_c0c = (float)((ulong)*(undefined8 *)(pafVar2[3] + 2) >> 0x20);
    local_c38 = (float)*(undefined8 *)pafVar2[2];
    fStack_c34 = (float)((ulong)*(undefined8 *)pafVar2[2] >> 0x20);
    fStack_c30 = (float)*(undefined8 *)(pafVar2[2] + 2);
    fStack_c2c = (float)((ulong)*(undefined8 *)(pafVar2[2] + 2) >> 0x20);
    local_c58 = (float)*(undefined8 *)pafVar2[3];
    fStack_c54 = (float)((ulong)*(undefined8 *)pafVar2[3] >> 0x20);
    fStack_c50 = (float)*(undefined8 *)(pafVar2[3] + 2);
    fStack_c4c = (float)((ulong)*(undefined8 *)(pafVar2[3] + 2) >> 0x20);
    local_c78 = (float)*(undefined8 *)pafVar2[2];
    fStack_c74 = (float)((ulong)*(undefined8 *)pafVar2[2] >> 0x20);
    fStack_c70 = (float)*(undefined8 *)(pafVar2[2] + 2);
    fStack_c6c = (float)((ulong)*(undefined8 *)(pafVar2[2] + 2) >> 0x20);
    local_c98 = (float)*(undefined8 *)pafVar2[5];
    fStack_c94 = (float)((ulong)*(undefined8 *)pafVar2[5] >> 0x20);
    fStack_c90 = (float)*(undefined8 *)(pafVar2[5] + 2);
    fStack_c8c = (float)((ulong)*(undefined8 *)(pafVar2[5] + 2) >> 0x20);
    local_cb8 = (float)*(undefined8 *)pafVar2[4];
    fStack_cb4 = (float)((ulong)*(undefined8 *)pafVar2[4] >> 0x20);
    fStack_cb0 = (float)*(undefined8 *)(pafVar2[4] + 2);
    fStack_cac = (float)((ulong)*(undefined8 *)(pafVar2[4] + 2) >> 0x20);
    local_cd8 = (float)*(undefined8 *)pafVar2[5];
    fStack_cd4 = (float)((ulong)*(undefined8 *)pafVar2[5] >> 0x20);
    fStack_cd0 = (float)*(undefined8 *)(pafVar2[5] + 2);
    fStack_ccc = (float)((ulong)*(undefined8 *)(pafVar2[5] + 2) >> 0x20);
    local_cf8 = (float)*(undefined8 *)pafVar2[4];
    fStack_cf4 = (float)((ulong)*(undefined8 *)pafVar2[4] >> 0x20);
    fStack_cf0 = (float)*(undefined8 *)(pafVar2[4] + 2);
    fStack_cec = (float)((ulong)*(undefined8 *)(pafVar2[4] + 2) >> 0x20);
    i0_1[3] = fVar5 * local_bb8 + fVar8 * local_bd8;
    i0_1[2] = local_d08 + local_d18 + local_d28 + local_d38;
    r0_1[1] = fVar6 * local_cb8 + fVar9 * local_cd8;
    r0_1[0] = fVar4 * local_c38 + fVar7 * local_c58;
    i1_1[3] = fVar11 * fStack_bb4 + fVar14 * fStack_bd4;
    i1_1[2] = fStack_d04 + fStack_d14 + fStack_d24 + fStack_d34;
    r1_1[1] = fVar12 * fStack_cb4 + fVar15 * fStack_cd4;
    r1_1[0] = fVar10 * fStack_c34 + fVar13 * fStack_c54;
    i2_1[3] = fVar17 * fStack_bb0 + fVar20 * fStack_bd0;
    i2_1[2] = fStack_d00 + fStack_d10 + fStack_d20 + fStack_d30;
    r2_1[1] = fVar18 * fStack_cb0 + fVar21 * fStack_cd0;
    r2_1[0] = fVar16 * fStack_c30 + fVar19 * fStack_c50;
    i3_1[3] = fVar23 * fStack_bac + fVar26 * fStack_bcc;
    i3_1[2] = fStack_cfc + fStack_d0c + fStack_d1c + fStack_d2c;
    r3_1[1] = fVar24 * fStack_cac + fVar27 * fStack_ccc;
    r3_1[0] = fVar22 * fStack_c2c + fVar25 * fStack_c4c;
    r1_1[3] = fVar8 * local_bf8 - fVar5 * local_b98;
    r1_1[2] = (local_d48 - local_d58) - (local_d68 - local_d78);
    i0_1[1] = fVar9 * local_cf8 - fVar6 * local_c98;
    i0_1[0] = fVar7 * local_c78 - fVar4 * local_c18;
    r2_1[3] = fVar14 * fStack_bf4 - fVar11 * fStack_b94;
    r2_1[2] = (fStack_d44 - fStack_d54) - (fStack_d64 - fStack_d74);
    i1_1[1] = fVar15 * fStack_cf4 - fVar12 * fStack_c94;
    i1_1[0] = fVar13 * fStack_c74 - fVar10 * fStack_c14;
    r3_1[3] = fVar20 * fStack_bf0 - fVar17 * fStack_b90;
    r3_1[2] = (fStack_d40 - fStack_d50) - (fStack_d60 - fStack_d70);
    i2_1[1] = fVar21 * fStack_cf0 - fVar18 * fStack_c90;
    i2_1[0] = fVar19 * fStack_c70 - fVar16 * fStack_c10;
    sr0_1[3] = fVar26 * fStack_bec - fVar23 * fStack_b8c;
    sr0_1[2] = (fStack_d3c - fStack_d4c) - (fStack_d5c - fStack_d6c);
    i3_1[1] = fVar27 * fStack_cec - fVar24 * fStack_c8c;
    i3_1[0] = fVar25 * fStack_c6c - fVar22 * fStack_c0c;
    *(undefined8 *)*pafVar1 = i0_1._8_8_;
    *(undefined8 *)(*pafVar1 + 2) = r0_1._0_8_;
    *(undefined8 *)pafVar1[1] = r1_1._8_8_;
    *(undefined8 *)(pafVar1[1] + 2) = i0_1._0_8_;
    *(undefined8 *)pafVar1[2] = i1_1._8_8_;
    *(undefined8 *)(pafVar1[2] + 2) = r1_1._0_8_;
    *(undefined8 *)pafVar1[3] = r2_1._8_8_;
    *(undefined8 *)(pafVar1[3] + 2) = i1_1._0_8_;
    *(undefined8 *)pafVar1[4] = i2_1._8_8_;
    *(undefined8 *)(pafVar1[4] + 2) = r2_1._0_8_;
    *(undefined8 *)pafVar1[5] = r3_1._8_8_;
    *(undefined8 *)(pafVar1[5] + 2) = i2_1._0_8_;
    *(undefined8 *)pafVar1[6] = i3_1._8_8_;
    *(undefined8 *)(pafVar1[6] + 2) = r3_1._0_8_;
    *(undefined8 *)pafVar1[7] = sr0_1._8_8_;
    *(undefined8 *)(pafVar1[7] + 2) = i3_1._0_8_;
  }
  (*out)[0] = Xr.v[0] + Xr.v[0] + Xi.v[2] + uout._0_4_;
  (*out)[1] = (Xi.v[2] - uout._0_4_) - (Xi.v[0] + Xi.v[0]);
  (*out)[2] = (Xi.v[2] + uout._0_4_) - (Xr.v[0] + Xr.v[0]);
  (*out)[3] = Xi.v[0] + Xi.v[0] + (Xi.v[2] - uout._0_4_);
  out[in_local._4_4_ * 2 + -1][0] = (Xi.v[3] + Xr.v[1]) * 2.0;
  out[in_local._4_4_ * 2 + -1][1] =
       (Xi.v[3] - Xr.v[1]) * 1.4142135 + -((uout._4_4_ + Xi.v[1]) * 1.4142135);
  out[in_local._4_4_ * 2 + -1][2] = (Xi.v[1] - uout._4_4_) * 2.0;
  out[in_local._4_4_ * 2 + -1][3] =
       (Xi.v[3] - Xr.v[1]) * -1.4142135 + -((uout._4_4_ + Xi.v[1]) * 1.4142135);
  return;
}

Assistant:

static NEVER_INLINE(void) pffft_real_preprocess(int Ncvec, const v4sf *in, v4sf *out, const v4sf *e) {
  int k, dk = Ncvec/SIMD_SZ; // number of 4x4 matrix blocks
  /* fftpack order is f0r f1r f1i f2r f2i ... f(n-1)r f(n-1)i f(n)r */

  v4sf_union Xr, Xi, *uout = (v4sf_union*)out;
  float cr0, ci0, cr1, ci1, cr2, ci2, cr3, ci3;
  static const float s = M_SQRT2;
  assert(in != out);
  for (k=0; k < 4; ++k) {
    Xr.f[k] = ((float*)in)[8*k];
    Xi.f[k] = ((float*)in)[8*k+4];
  }

  pffft_real_preprocess_4x4(in, e, out+1, 1); // will write only 6 values

  /*
    [Xr0 Xr1 Xr2 Xr3 Xi0 Xi1 Xi2 Xi3]

    [cr0] [1   0   2   0   1   0   0   0]
    [cr1] [1   0   0   0  -1   0  -2   0]
    [cr2] [1   0  -2   0   1   0   0   0]
    [cr3] [1   0   0   0  -1   0   2   0]
    [ci0] [0   2   0   2   0   0   0   0]
    [ci1] [0   s   0  -s   0  -s   0  -s]
    [ci2] [0   0   0   0   0  -2   0   2]
    [ci3] [0  -s   0   s   0  -s   0  -s]
  */
  for (k=1; k < dk; ++k) {    
    pffft_real_preprocess_4x4(in+8*k, e + k*6, out-1+k*8, 0);
  }

  cr0=(Xr.f[0]+Xi.f[0]) + 2*Xr.f[2]; uout[0].f[0] = cr0;
  cr1=(Xr.f[0]-Xi.f[0]) - 2*Xi.f[2]; uout[0].f[1] = cr1;
  cr2=(Xr.f[0]+Xi.f[0]) - 2*Xr.f[2]; uout[0].f[2] = cr2;
  cr3=(Xr.f[0]-Xi.f[0]) + 2*Xi.f[2]; uout[0].f[3] = cr3;
  ci0= 2*(Xr.f[1]+Xr.f[3]);                       uout[2*Ncvec-1].f[0] = ci0;
  ci1= s*(Xr.f[1]-Xr.f[3]) - s*(Xi.f[1]+Xi.f[3]); uout[2*Ncvec-1].f[1] = ci1;
  ci2= 2*(Xi.f[3]-Xi.f[1]);                       uout[2*Ncvec-1].f[2] = ci2;
  ci3=-s*(Xr.f[1]-Xr.f[3]) - s*(Xi.f[1]+Xi.f[3]); uout[2*Ncvec-1].f[3] = ci3;
}